

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentLexer.cxx
# Opt level: O0

void cmCommandArgument_SetupEscapes(yyscan_t yyscanner,bool noEscapes)

{
  yyguts_t *yyg;
  bool noEscapes_local;
  yyscan_t yyscanner_local;
  
  if (noEscapes) {
    *(undefined4 *)((long)yyscanner + 0x4c) = 5;
  }
  else {
    *(undefined4 *)((long)yyscanner + 0x4c) = 3;
  }
  return;
}

Assistant:

void cmCommandArgument_SetupEscapes(yyscan_t yyscanner, bool noEscapes)
{
  /* Hack into the internal flex-generated scanner to set the state.  */
  struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;
  if(noEscapes) {
    BEGIN(NOESCAPES);
  } else {
    BEGIN(ESCAPES);
  }
}